

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observables.hh
# Opt level: O1

double __thiscall SSM::TwoByteObservable::convert(TwoByteObservable *this,const_iterator input)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 in_RDX;
  double extraout_XMM0_Qa;
  
  UNRECOVERED_JUMPTABLE = (this->super_Observable)._vptr_Observable[6];
  (*UNRECOVERED_JUMPTABLE)
            (this,(ulong)(ushort)(*(undefined2 *)input._M_current << 8 |
                                 (ushort)*(undefined2 *)input._M_current >> 8),in_RDX,
             UNRECOVERED_JUMPTABLE);
  return extraout_XMM0_Qa;
}

Assistant:

double convert(Bytes::const_iterator input) const override
    {
      uint16_t raw0 = std::to_integer<uint16_t>(*(input+0));
      uint16_t raw1 = std::to_integer<uint16_t>(*(input+1));
      return convert((raw0 << 8) | raw1);
    }